

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyExporter.cpp
# Opt level: O3

void Assimp::ExportScenePly
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *param_4)

{
  _Alloc_hider _Var1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 uVar4;
  runtime_error *prVar5;
  PlyExporter exporter;
  allocator<char> local_219;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  PlyExporter local_1d8;
  long *plVar3;
  
  PlyExporter::PlyExporter(&local_1d8,pFile,pScene,false);
  if (((&local_1d8.field_0x20)[*(long *)(local_1d8._0_8_ + -0x18)] & 5) != 0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,pFile,&local_219);
    std::operator+(&local_218,"output data creation failed. Most likely the file became too large: "
                   ,&local_1f8);
    std::runtime_error::runtime_error(prVar5,(string *)&local_218);
    *(undefined ***)prVar5 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFile,"wt");
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  if (plVar3 != (long *)0x0) {
    std::__cxx11::stringbuf::str();
    _Var1._M_p = local_218._M_dataplus._M_p;
    uVar4 = std::ostream::tellp();
    (**(code **)(*plVar3 + 0x18))(plVar3,_Var1._M_p,uVar4,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    (**(code **)(*plVar3 + 8))(plVar3);
    PlyExporter::~PlyExporter(&local_1d8);
    return;
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,pFile,&local_219);
  std::operator+(&local_218,"could not open output .ply file: ",&local_1f8);
  std::runtime_error::runtime_error(prVar5,(string *)&local_218);
  *(undefined ***)prVar5 = &PTR__runtime_error_0080bf48;
  __cxa_throw(prVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ExportScenePly(const char* pFile,IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* /*pProperties*/)
{
    // invoke the exporter
    PlyExporter exporter(pFile, pScene);

    if (exporter.mOutput.fail()) {
        throw DeadlyExportError("output data creation failed. Most likely the file became too large: " + std::string(pFile));
    }

    // we're still here - export successfully completed. Write the file.
    std::unique_ptr<IOStream> outfile (pIOSystem->Open(pFile,"wt"));
    if(outfile == NULL) {
        throw DeadlyExportError("could not open output .ply file: " + std::string(pFile));
    }

    outfile->Write( exporter.mOutput.str().c_str(), static_cast<size_t>(exporter.mOutput.tellp()),1);
}